

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseExpressionE(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *r;
  FxExpression *this;
  PClassActor *size;
  bool bVar2;
  FxExpression *right;
  FxExpression *pFStack_20;
  int token;
  FxExpression *tmp;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  pFStack_20 = ParseExpressionD(sc,cls);
  while( true ) {
    bVar1 = FScanner::GetToken(sc);
    bVar2 = false;
    if (((bVar1) && (bVar2 = true, sc->TokenType != 0x118)) &&
       (bVar2 = true, sc->TokenType != 0x116)) {
      bVar2 = sc->TokenType == 0x117;
    }
    if (!bVar2) break;
    o = sc->TokenType;
    size = cls;
    r = ParseExpressionD(sc,cls);
    this = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)size);
    FxShift::FxShift((FxShift *)this,o,pFStack_20,r);
    pFStack_20 = this;
  }
  if ((sc->End & 1U) == 0) {
    FScanner::UnGet(sc);
  }
  return pFStack_20;
}

Assistant:

static FxExpression *ParseExpressionE (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionD (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_LShift || sc.TokenType == TK_RShift || sc.TokenType == TK_URShift))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionD (sc, cls);
		tmp = new FxShift(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}